

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

VariableLookupPtr __thiscall Lodtalk::LocalScope::lookSymbol(LocalScope *this,Oop symbol)

{
  element_type *peVar1;
  long lVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar3;
  long lVar4;
  VariableLookupPtr VVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  VMContext *local_30;
  
  local_38 = in_RDX;
  local_30 = getCurrentContext();
  OopRef::registerSelf((OopRef *)&local_38);
  lVar3 = (long)symbol.field_0 + 0x20;
  lVar2 = lVar3;
  for (lVar4 = *(long *)((long)symbol.field_0 + 0x28); lVar4 != 0;
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(long *)(lVar4 + 0x20) < local_38.intValue) * 8)) {
    if (local_38.intValue <= *(long *)(lVar4 + 0x20)) {
      lVar2 = lVar4;
    }
  }
  lVar4 = lVar3;
  if ((lVar2 != lVar3) && (lVar4 = lVar2, local_38.intValue < *(long *)(lVar2 + 0x20))) {
    lVar4 = lVar3;
  }
  OopRef::unregisterSelf((OopRef *)&local_38);
  if (lVar4 == lVar3) {
    (this->super_EvaluationScope)._vptr_EvaluationScope = (_func_int **)0x0;
    (this->super_EvaluationScope).parentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    (this->super_EvaluationScope)._vptr_EvaluationScope = *(_func_int ***)(lVar4 + 0x40);
    peVar1 = *(element_type **)(lVar4 + 0x48);
    (this->super_EvaluationScope).parentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    if (peVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(peVar1->parentScope).
                 super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->parentScope).
                      super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(peVar1->parentScope).
                 super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->parentScope).
                      super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
  }
  VVar5.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar5.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariableLookupPtr)
         VVar5.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariableLookupPtr LocalScope::lookSymbol(Oop symbol)
{
	auto it = variables.find(symbol);
	if(it != variables.end())
		return it->second;
	return VariableLookupPtr();
}